

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boundary_matrix.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,false,true>>>
::_container_insert<std::initializer_list<unsigned_int>>
          (Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,false,true>>>
           *this,initializer_list<unsigned_int> *column,Index pos,Dimension dim)

{
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_true>_>_>
  local_58;
  Dimension local_20;
  Index local_1c;
  Dimension dim_local;
  Index pos_local;
  initializer_list<unsigned_int> *column_local;
  Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_true>_>_>
  *this_local;
  
  local_20 = dim;
  local_1c = pos;
  _dim_local = column;
  column_local = (initializer_list<unsigned_int> *)this;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,false,true>>>
  ::
  Intrusive_list_column<std::initializer_list<unsigned_int>,std::map<unsigned_int,std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,false,true>>>,Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,false,true>>::RowEntryComp,std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,false,true>>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,false,true>>>,Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,false,true>>::RowEntryComp,std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,false,true>>>>>>>>>
            ((Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,false,true>>>
              *)&local_58,pos,column,dim,
             *(map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_true>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_true>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_true>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_true>_>_>_>_>_>_>_>
               **)this,*(Column_settings **)(this + 0x48));
  std::
  unordered_map<unsigned_int,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,false,true>>>,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,false,true>>>>>>
  ::
  try_emplace<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,false,true>>>>
            ((unordered_map<unsigned_int,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,false,true>>>,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,false,true>>>>>>
              *)(this + 8),&local_1c,&local_58);
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_true>_>_>
  ::~Intrusive_list_column(&local_58);
  return;
}

Assistant:

inline void Boundary_matrix<Master_matrix>::_container_insert(const Container& column,
                                                              Index pos,
                                                              Dimension dim)
{
  if constexpr (Master_matrix::Option_list::has_map_column_container) {
    if constexpr (Master_matrix::Option_list::has_row_access) {
      matrix_.try_emplace(pos, Column(pos, column, dim, RA_opt::rows_, colSettings_));
    } else {
      matrix_.try_emplace(pos, Column(column, dim, colSettings_));
    }
  } else {
    if constexpr (Master_matrix::Option_list::has_row_access) {
      matrix_.emplace_back(pos, column, dim, RA_opt::rows_, colSettings_);
    } else {
      if (matrix_.size() <= pos) {
        matrix_.emplace_back(column, dim, colSettings_);
      } else {
        matrix_[pos] = Column(column, dim, colSettings_);
      }
    }
  }
  if constexpr (activeDimOption) {
    Dim_opt::update_up(dim);
  }
}